

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
::ExportConStatus(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
                  *this,int i_con,Container *cnt,ItemNamer *vnam,bool add2final)

{
  BasicLogger *pBVar1;
  BasicMemoryWriter<char,_std::allocator<char>_> *pBVar2;
  allocator<char> *alloc;
  Container *in_RDX;
  BasicCStringRef<char> in_RDI;
  byte in_R8B;
  MemoryWriter pr;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter wrt;
  char **in_stack_fffffffffffff9d8;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  allocator<char> *in_stack_fffffffffffff9e8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff9f0;
  allocator<char> *in_stack_fffffffffffff9f8;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *c;
  BasicCStringRef<char> in_stack_fffffffffffffa18;
  string_view in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  allocator<char> local_511 [585];
  basic_string_view<char,_std::char_traits<char>_> *local_2c8;
  BasicMemoryWriter<char,_std::allocator<char>_> *local_280;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_278 [2];
  undefined1 local_251 [560];
  byte local_21;
  Container *local_18;
  
  local_21 = in_R8B & 1;
  local_18 = in_RDX;
  pBVar1 = BasicConstraintKeeper::GetLogger((BasicConstraintKeeper *)in_stack_fffffffffffff9e0);
  if (pBVar1 != (BasicLogger *)0x0) {
    c = (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *)local_251;
    std::allocator<char>::allocator();
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    std::allocator<char>::~allocator((allocator<char> *)local_251);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::MiniJSONWriter
              (local_278,(BasicMemoryWriter<char,_std::allocator<char>_> *)(local_251 + 1));
    pBVar2 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
             BasicConstraintKeeper::GetShortTypeName
                       ((BasicConstraintKeeper *)
                        CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    local_280 = pBVar2;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffffa18.data_,in_stack_fffffffffffffa20);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x5d0c95);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffffa18.data_,in_stack_fffffffffffffa20);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9e0,(int *)in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x5d0cf4);
    Container::GetCon((Container *)0x5d0d01);
    alloc = (allocator<char> *)BasicConstraint::name((BasicConstraint *)0x5d0d09);
    if (*alloc != (allocator<char>)0x0) {
      Container::GetCon((Container *)0x5d0d2b);
      in_stack_fffffffffffff9f0 =
           (basic_string_view<char,_std::char_traits<char>_> *)
           BasicConstraint::name((BasicConstraint *)0x5d0d33);
      local_2c8 = in_stack_fffffffffffff9f0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 in_stack_fffffffffffffa18.data_,in_stack_fffffffffffffa20);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x5d0da6);
      in_stack_fffffffffffff9e8 = local_511;
      std::allocator<char>::allocator();
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter(pBVar2,alloc);
      std::allocator<char>::~allocator(local_511);
      Container::GetCon((Container *)0x5d0de6);
      WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>>
                ((BasicMemoryWriter<char,_std::allocator<char>_> *)in_RDI.data_,c,
                 (ItemNamer *)pBVar2);
      in_stack_fffffffffffff9e0 =
           (BasicMemoryWriter<char,_std::allocator<char>_> *)
           fmt::BasicWriter<char>::c_str(&in_stack_fffffffffffff9e0->super_BasicWriter<char>);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 in_stack_fffffffffffffa18.data_,in_stack_fffffffffffffa20);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x5d0e80);
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
                (in_stack_fffffffffffff9e0);
    }
    Container::GetDepth(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffffa18.data_,in_stack_fffffffffffffa20);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9e0,(int *)in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x5d103e);
    Container::IsUnused(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffffa18.data_,in_stack_fffffffffffffa20);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9e0,(int *)in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x5d10b4);
    Container::IsBridged(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffffa18.data_,in_stack_fffffffffffffa20);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9e0,(int *)in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x5d1121);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffffa18.data_,in_stack_fffffffffffffa20);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9e0,(int *)in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x5d117a);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x5d1187);
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xfffffffffffffa18,"\n");
    fmt::BasicWriter<char>::write<>((BasicWriter<char> *)c,in_RDI);
    pBVar2 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
             BasicConstraintKeeper::GetLogger((BasicConstraintKeeper *)in_stack_fffffffffffff9e0);
    BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>
              ((BasicLogger *)in_stack_fffffffffffff9e0,pBVar2);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
              (in_stack_fffffffffffff9e0);
  }
  return;
}

Assistant:

void ExportConStatus(int i_con, const Container& cnt,
                       ItemNamer& vnam, bool add2final) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["index"] = i_con;
        if (*cnt.GetCon().name()) {
          jw["name"] = cnt.GetCon().name();
          {
            fmt::MemoryWriter pr;
            WriteFlatCon(pr, cnt.GetCon(), vnam);
            jw["printed"] = pr.c_str();
          }
        }
        jw["depth"] = cnt.GetDepth();
        jw["unused"] = (int)cnt.IsUnused();
        jw["bridged"] = (int)cnt.IsBridged();
        jw["final"] = (int)add2final;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }